

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

string * __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::trace_error_abi_cxx11_
          (string *__return_storage_ptr__,BinBinaryReader *this)

{
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  __tmp;
  pointer ppVar1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppVar1 = (this->error).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (ppVar1 != (this->error).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&ppVar1[-1].first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," @ ");
    std::__cxx11::to_string(&local_50,(long)(this->reader).beg_ - (long)ppVar1[-1].second);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
    ppVar1 = ppVar1 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trace_error() noexcept {
            std::string trace;
            for(auto e = error.crbegin(); e != error.crend(); e++) {
                trace.append(e->first);
                trace.append(" @ ");
                trace.append(std::to_string(reader.beg_ - e->second));
                trace.append("\n");
            }
            return trace;
        }